

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FloatValue::ByteSizeLong(FloatValue *this)

{
  size_t sVar1;
  
  sVar1 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,
                     (ulong)((this->field_0)._impl_.value_ != 0.0 & *(byte *)&this->field_0) * 5,
                     &(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t FloatValue::ByteSizeLong() const {
  const FloatValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FloatValue)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // float value = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_value()) != 0) {
        total_size += 5;
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}